

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktGeometryVaryingGeometryShaderTests.cpp
# Opt level: O0

TestCaseGroup * vkt::geometry::createVaryingGeometryShaderTests(TestContext *testCtx)

{
  int iVar1;
  TestCaseGroup *pTVar2;
  TestNode *this;
  VaryingTest *this_00;
  int local_4c;
  allocator<char> local_46;
  allocator<char> local_45;
  int ndx;
  allocator<char> local_40;
  allocator<char> local_3f;
  undefined1 local_3e;
  allocator<char> local_3d;
  allocator<char> local_3c;
  undefined1 local_3b;
  allocator<char> local_3a;
  allocator<char> local_39;
  VaryingTestSpec *local_38;
  DefaultDeleter<tcu::TestCaseGroup> local_2d [13];
  undefined1 local_20 [8];
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> varyingGroup;
  TestContext *testCtx_local;
  
  varyingGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
  _8_8_ = testCtx;
  pTVar2 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar2,(TestContext *)
                    varyingGroup.
                    super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                    m_data._8_8_,"varying","Test varyings.");
  de::DefaultDeleter<tcu::TestCaseGroup>::DefaultDeleter(local_2d);
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_20,pTVar2
            );
  if (createVaryingGeometryShaderTests(tcu::TestContext&)::varyingTests == '\0') {
    iVar1 = __cxa_guard_acquire(&createVaryingGeometryShaderTests(tcu::TestContext&)::varyingTests);
    if (iVar1 != 0) {
      local_38 = createVaryingGeometryShaderTests::varyingTests;
      createVaryingGeometryShaderTests::varyingTests[0].vertexOutputs = VERTEXT_NO_OP;
      createVaryingGeometryShaderTests::varyingTests[0].geometryOutputs = GEOMETRY_ONE;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&createVaryingGeometryShaderTests::varyingTests[0].name,
                 "vertex_no_op_geometry_out_1",&local_39);
      local_3b = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&createVaryingGeometryShaderTests::varyingTests[0].desc,
                 "vertex_no_op_geometry_out_1",&local_3a);
      local_3b = 0;
      local_38 = (VaryingTestSpec *)0x16b83d8;
      createVaryingGeometryShaderTests::varyingTests[1].vertexOutputs = VERTEXT_ZERO;
      createVaryingGeometryShaderTests::varyingTests[1].geometryOutputs = GEOMETRY_ONE;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&createVaryingGeometryShaderTests::varyingTests[1].name,
                 "vertex_out_0_geometry_out_1",&local_3c);
      local_3e = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&createVaryingGeometryShaderTests::varyingTests[1].desc,
                 "vertex_out_0_geometry_out_1",&local_3d);
      local_3e = 0;
      local_38 = (VaryingTestSpec *)0x16b8420;
      createVaryingGeometryShaderTests::varyingTests[2].vertexOutputs = VERTEXT_ZERO;
      createVaryingGeometryShaderTests::varyingTests[2].geometryOutputs = GEOMETRY_TWO;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&createVaryingGeometryShaderTests::varyingTests[2].name,
                 "vertex_out_0_geometry_out_2",&local_3f);
      ndx._3_1_ = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&createVaryingGeometryShaderTests::varyingTests[2].desc,
                 "vertex_out_0_geometry_out_2",&local_40);
      ndx._3_1_ = 0;
      local_38 = (VaryingTestSpec *)0x16b8468;
      createVaryingGeometryShaderTests::varyingTests[3].vertexOutputs = VERTEXT_ONE;
      createVaryingGeometryShaderTests::varyingTests[3].geometryOutputs = GEOMETRY_ZERO;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&createVaryingGeometryShaderTests::varyingTests[3].name,
                 "vertex_out_1_geometry_out_0",(allocator<char> *)((long)&ndx + 2));
      ndx._0_1_ = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&createVaryingGeometryShaderTests::varyingTests[3].desc,
                 "vertex_out_1_geometry_out_0",(allocator<char> *)((long)&ndx + 1));
      ndx._0_1_ = 0;
      local_38 = (VaryingTestSpec *)0x16b84b0;
      createVaryingGeometryShaderTests::varyingTests[4].vertexOutputs = VERTEXT_ONE;
      createVaryingGeometryShaderTests::varyingTests[4].geometryOutputs = GEOMETRY_TWO;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&createVaryingGeometryShaderTests::varyingTests[4].name,
                 "vertex_out_1_geometry_out_2",&local_45);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&createVaryingGeometryShaderTests::varyingTests[4].desc,
                 "vertex_out_1_geometry_out_2",&local_46);
      std::allocator<char>::~allocator(&local_46);
      std::allocator<char>::~allocator(&local_45);
      std::allocator<char>::~allocator((allocator<char> *)((long)&ndx + 1));
      std::allocator<char>::~allocator((allocator<char> *)((long)&ndx + 2));
      std::allocator<char>::~allocator(&local_40);
      std::allocator<char>::~allocator(&local_3f);
      std::allocator<char>::~allocator(&local_3d);
      std::allocator<char>::~allocator(&local_3c);
      std::allocator<char>::~allocator(&local_3a);
      std::allocator<char>::~allocator(&local_39);
      __cxa_atexit(__cxx_global_array_dtor,0,&__dso_handle);
      __cxa_guard_release(&createVaryingGeometryShaderTests(tcu::TestContext&)::varyingTests);
    }
  }
  for (local_4c = 0; local_4c < 5; local_4c = local_4c + 1) {
    this = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_20)->super_TestNode;
    this_00 = (VaryingTest *)operator_new(0xb8);
    anon_unknown_1::VaryingTest::VaryingTest
              (this_00,(TestContext *)
                       varyingGroup.
                       super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                       .m_data._8_8_,createVaryingGeometryShaderTests::varyingTests + local_4c);
    tcu::TestNode::addChild(this,(TestNode *)this_00);
  }
  pTVar2 = de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
           release((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_20)
  ;
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_20);
  return pTVar2;
}

Assistant:

TestCaseGroup* createVaryingGeometryShaderTests (TestContext& testCtx)
{
	MovePtr<TestCaseGroup> varyingGroup	(new TestCaseGroup(testCtx, "varying",  "Test varyings."));

	// varying
	{
		static const VaryingTestSpec varyingTests[] =
		{
			{ VERTEXT_NO_OP,	GEOMETRY_ONE,	"vertex_no_op_geometry_out_1", "vertex_no_op_geometry_out_1" },
			{ VERTEXT_ZERO,		GEOMETRY_ONE,	"vertex_out_0_geometry_out_1", "vertex_out_0_geometry_out_1" },
			{ VERTEXT_ZERO,		GEOMETRY_TWO,	"vertex_out_0_geometry_out_2", "vertex_out_0_geometry_out_2" },
			{ VERTEXT_ONE,		GEOMETRY_ZERO,	"vertex_out_1_geometry_out_0", "vertex_out_1_geometry_out_0" },
			{ VERTEXT_ONE,		GEOMETRY_TWO,	"vertex_out_1_geometry_out_2", "vertex_out_1_geometry_out_2" },
		};

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(varyingTests); ++ndx)
			varyingGroup->addChild(new VaryingTest(testCtx, varyingTests[ndx]));
	}

	return varyingGroup.release();
}